

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracer.cpp
# Opt level: O2

void __thiscall
PathTracer::create_target_images
          (PathTracer *this,shared_ptr<myvk::Device> *device,
          vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
          *access_queue)

{
  __shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2> local_58;
  VkExtent2D local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_48.width = this->m_width;
  local_48.height = this->m_height;
  myvk::Image::CreateTexture2D
            ((Image *)&local_58,device,&local_48,1,VK_FORMAT_R32G32B32A32_SFLOAT,0xb,access_queue);
  std::__shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_color_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2> *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  local_48.width = this->m_width;
  local_48.height = this->m_height;
  myvk::Image::CreateTexture2D
            ((Image *)&local_58,device,&local_48,1,VK_FORMAT_R8G8B8A8_UNORM,0xb,access_queue);
  local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->m_albedo_image;
  std::__shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2> *)local_38._M_pi,
             (__shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2> *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  local_48.width = this->m_width;
  local_48.height = this->m_height;
  myvk::Image::CreateTexture2D
            ((Image *)&local_58,device,&local_48,1,VK_FORMAT_R8G8B8A8_SNORM,0xb,access_queue);
  std::__shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_normal_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2> *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  std::__shared_ptr<myvk::ImageBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Image,void>
            ((__shared_ptr<myvk::ImageBase,(__gnu_cxx::_Lock_policy)2> *)&local_48,
             &(this->m_color_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>);
  myvk::ImageView::Create
            ((ImageView *)&local_58,(Ptr<ImageBase> *)&local_48,VK_IMAGE_VIEW_TYPE_2D,1);
  std::__shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_color_image_view).
              super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  std::__shared_ptr<myvk::ImageBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Image,void>
            ((__shared_ptr<myvk::ImageBase,(__gnu_cxx::_Lock_policy)2> *)&local_48,
             (__shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2> *)local_38._M_pi);
  myvk::ImageView::Create
            ((ImageView *)&local_58,(Ptr<ImageBase> *)&local_48,VK_IMAGE_VIEW_TYPE_2D,1);
  std::__shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_albedo_image_view).
              super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  std::__shared_ptr<myvk::ImageBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Image,void>
            ((__shared_ptr<myvk::ImageBase,(__gnu_cxx::_Lock_policy)2> *)&local_48,
             &(this->m_normal_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>);
  myvk::ImageView::Create
            ((ImageView *)&local_58,(Ptr<ImageBase> *)&local_48,VK_IMAGE_VIEW_TYPE_2D,1);
  std::__shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_normal_image_view).
              super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  return;
}

Assistant:

void PathTracer::create_target_images(const std::shared_ptr<myvk::Device> &device,
                                      const std::vector<std::shared_ptr<myvk::Queue>> &access_queue) {
	m_color_image = myvk::Image::CreateTexture2D(
	    device, {m_width, m_height}, 1, VK_FORMAT_R32G32B32A32_SFLOAT,
	    VK_IMAGE_USAGE_TRANSFER_DST_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_STORAGE_BIT, access_queue);
	m_albedo_image = myvk::Image::CreateTexture2D(
	    device, {m_width, m_height}, 1, VK_FORMAT_R8G8B8A8_UNORM,
	    VK_IMAGE_USAGE_TRANSFER_DST_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_STORAGE_BIT, access_queue);
	m_normal_image = myvk::Image::CreateTexture2D(
	    device, {m_width, m_height}, 1, VK_FORMAT_R8G8B8A8_SNORM,
	    VK_IMAGE_USAGE_TRANSFER_DST_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_STORAGE_BIT, access_queue);

	m_color_image_view = myvk::ImageView::Create(m_color_image, VK_IMAGE_VIEW_TYPE_2D);
	m_albedo_image_view = myvk::ImageView::Create(m_albedo_image, VK_IMAGE_VIEW_TYPE_2D);
	m_normal_image_view = myvk::ImageView::Create(m_normal_image, VK_IMAGE_VIEW_TYPE_2D);
}